

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderProgram.cpp
# Opt level: O0

void __thiscall glu::Program::Program(Program *this,RenderContext *renderCtx,deUint32 program)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_ECX;
  string local_50;
  deUint32 local_1c;
  RenderContext *pRStack_18;
  deUint32 program_local;
  RenderContext *renderCtx_local;
  Program *this_local;
  
  local_1c = program;
  pRStack_18 = renderCtx;
  renderCtx_local = (RenderContext *)this;
  iVar2 = (*renderCtx->_vptr_RenderContext[3])();
  this->m_gl = (Functions *)CONCAT44(extraout_var,iVar2);
  this->m_program = local_1c;
  ProgramInfo::ProgramInfo(&this->m_info);
  bVar1 = getProgramLinkStatus(this->m_gl,local_1c);
  (this->m_info).linkOk = bVar1;
  getProgramInfoLog_abi_cxx11_
            (&local_50,(glu *)this->m_gl,(Functions *)(ulong)local_1c,
             CONCAT31((int3)((uint)in_ECX >> 8),bVar1));
  std::__cxx11::string::operator=((string *)&this->m_info,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

Program::Program (const RenderContext& renderCtx, deUint32 program)
	: m_gl		(renderCtx.getFunctions())
	, m_program	(program)
{
	m_info.linkOk	= getProgramLinkStatus(m_gl, program);
	m_info.infoLog	= getProgramInfoLog(m_gl, program);
}